

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *enumNode)

{
  ListElementCount LVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  ElementCount EVar5;
  ulong __n;
  bool *__s;
  ElementCount index;
  bool bVar6;
  Array<bool> sawCodeOrder_heap;
  bool _kjCondition;
  undefined7 uStack_107;
  undefined1 local_100 [16];
  PointerReader local_f0;
  Reader enumerant;
  Fault f;
  Reader enumerants;
  bool sawCodeOrder_stack [32];
  
  if ((enumNode->_reader).pointerCount < 4) {
    enumerant._reader.pointers._0_4_ = 0x7fffffff;
    enumerant._reader.capTable = (CapTableReader *)0x0;
    enumerant._reader.data = (WirePointer *)0x0;
    enumerant._reader.segment = (SegmentReader *)0x0;
  }
  else {
    enumerant._reader.segment = (enumNode->_reader).segment;
    enumerant._reader.capTable = (enumNode->_reader).capTable;
    enumerant._reader.data = (enumNode->_reader).pointers + 3;
    enumerant._reader.pointers._0_4_ = (enumNode->_reader).nestingLimit;
  }
  capnp::_::PointerReader::getList
            (&enumerants.reader,(PointerReader *)&enumerant,INLINE_COMPOSITE,(word *)0x0);
  LVar1 = enumerants.reader.elementCount;
  uVar2 = (ulong)enumerants.reader.elementCount;
  if (uVar2 < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
  }
  else {
    sawCodeOrder_heap.ptr =
         (bool *)kj::_::HeapArrayDisposer::allocateImpl
                           (1,uVar2,uVar2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.size_ = uVar2;
  }
  __n = sawCodeOrder_heap.size_;
  __s = sawCodeOrder_heap.ptr;
  if (LVar1 < 0x21) {
    __n = uVar2;
    __s = sawCodeOrder_stack;
  }
  index = 0;
  memset(__s,0,__n);
  if (enumerants.reader.elementCount != 0) {
    EVar5 = enumerants.reader.elementCount - 1;
    do {
      capnp::_::ListReader::getStructElement(&enumerant._reader,&enumerants.reader,index);
      local_f0.capTable = enumerant._reader.capTable;
      local_f0.segment = enumerant._reader.segment;
      local_f0.nestingLimit = enumerant._reader.nestingLimit;
      local_f0.pointer._0_4_ = (int)enumerant._reader.pointers;
      local_f0.pointer._4_4_ = enumerant._reader.pointers._4_4_;
      if (enumerant._reader.pointerCount == 0) {
        local_f0.pointer._0_4_ = 0;
        local_f0.pointer._4_4_ = FAILED;
        local_f0.capTable = (CapTableReader *)0x0;
        local_f0.segment = (SegmentReader *)0x0;
        local_f0.nestingLimit = 0x7fffffff;
      }
      local_100 = (undefined1  [16])
                  capnp::_::PointerReader::getBlob<capnp::Text>(&local_f0,(void *)0x0,0);
      f.exception = (Exception *)local_100;
      local_f0.pointer = (WirePointer *)CONCAT44(local_f0.pointer._4_4_,index);
      __kjCondition = (anon_class_16_2_3f8e8a0c *)&f;
      local_f0._0_16_ = local_100;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                ((Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                  *)&this->members,(Entry *)&local_f0,(anon_class_8_1_6f242a07 *)&_kjCondition);
      uVar3 = 0;
      if (0xf < enumerant._reader.dataSize) {
        uVar3 = (uint)*enumerant._reader.data;
      }
      if (uVar3 < enumerants.reader.elementCount) {
        if (enumerant._reader.dataSize < 0x10) {
          uVar2 = 0;
        }
        else {
          uVar2 = (ulong)*enumerant._reader.data;
        }
        bVar4 = __s[uVar2] ^ 1;
      }
      else {
        bVar4 = 0;
      }
      _kjCondition = (bool)bVar4;
      if (bVar4 == 0) {
        if (enumerant._reader.pointerCount == 0) {
          enumerant._reader.nestingLimit = 0x7fffffff;
          local_f0.capTable = (CapTableReader *)0x0;
          local_f0.pointer = (WirePointer *)0x0;
          local_f0.segment = (SegmentReader *)0x0;
        }
        else {
          local_f0.pointer =
               (WirePointer *)
               CONCAT44(enumerant._reader.pointers._4_4_,(int)enumerant._reader.pointers);
          local_f0.capTable = enumerant._reader.capTable;
          local_f0.segment = enumerant._reader.segment;
        }
        local_f0.nestingLimit = enumerant._reader.nestingLimit;
        local_100 = (undefined1  [16])
                    capnp::_::PointerReader::getBlob<capnp::Text>(&local_f0,(void *)0x0,0);
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18],capnp::Text::Reader>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x1a5,FAILED,
                   "enumerant.getCodeOrder() < enumerants.size() && !sawCodeOrder[enumerant.getCodeOrder()]"
                   ,"_kjCondition,\"invalid codeOrder\", enumerant.getName()",&_kjCondition,
                   (char (*) [18])"invalid codeOrder",(Reader *)local_100);
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        break;
      }
      if (enumerant._reader.dataSize < 0x10) {
        uVar2 = 0;
      }
      else {
        uVar2 = (ulong)*enumerant._reader.data;
      }
      __s[uVar2] = true;
      bVar6 = EVar5 != index;
      index = index + 1;
    } while ((bVar4 & bVar6) != 0);
  }
  if (sawCodeOrder_heap.ptr != (bool *)0x0) {
    (**(sawCodeOrder_heap.disposer)->_vptr_ArrayDisposer)
              (sawCodeOrder_heap.disposer,sawCodeOrder_heap.ptr,1,sawCodeOrder_heap.size_,
               sawCodeOrder_heap.size_,0,0,0);
  }
  return;
}

Assistant:

KJ_STACK_ARRAY(bool, sawCodeOrder, enumerants.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto enumerant: enumerants) {
      validateMemberName(enumerant.getName(), index++);

      VALIDATE_SCHEMA(enumerant.getCodeOrder() < enumerants.size() &&
                      !sawCodeOrder[enumerant.getCodeOrder()],
                      "invalid codeOrder", enumerant.getName());
      sawCodeOrder[enumerant.getCodeOrder()] = true;
    }